

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

uchar AR_EQ(uint *a,uint *b,uint size)

{
  ulong uVar1;
  ulong uVar2;
  
  if (size == 0) {
    return '\x01';
  }
  if (*a != *b) {
    return '\0';
  }
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    if (size == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (a[uVar2] == b[uVar2]);
  return size <= uVar2;
}

Assistant:

uint8_t AR_EQ(uint32_t *a, uint32_t *b, uint32_t size)
{
    for (uint32_t i = 0; i < size; i++)
        if (a[i] != b[i])
            return 0;
    return 1;
}